

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsExecuter.h
# Opt level: O0

void __thiscall
Refal2::COperationsExecuter::macthLeftMaxByQualifierSaveToTable_E
          (COperationsExecuter *this,TQualifierIndex qualifier)

{
  bool bVar1;
  CNode<Refal2::CUnit> *pCVar2;
  CUnitNode **ppCVar3;
  CNode<Refal2::CUnit> *pCVar4;
  bool local_29;
  CUnitNode *first;
  TQualifierIndex qualifier_local;
  COperationsExecuter *this_local;
  
  pCVar4 = this->left;
  while( true ) {
    bVar1 = isEmpty(this);
    local_29 = false;
    if (!bVar1) {
      pCVar2 = CNode<Refal2::CUnit>::Next(this->left);
      local_29 = checkQualifier(this,pCVar2,qualifier);
    }
    if (local_29 == false) break;
    pCVar2 = CNode<Refal2::CUnit>::Next(this->left);
    this->left = pCVar2;
    bVar1 = CUnit::IsLeftParen(&this->left->super_CUnit);
    if (bVar1) {
      ppCVar3 = CUnit::PairedParen(&this->left->super_CUnit);
      this->left = *ppCVar3;
    }
  }
  if (this->left == pCVar4) {
    saveToTable(this,(CUnitNode *)0x0,(CUnitNode *)0x0);
  }
  else {
    pCVar4 = CNode<Refal2::CUnit>::Next(pCVar4);
    saveToTable(this,pCVar4,this->left);
  }
  return;
}

Assistant:

inline void COperationsExecuter::macthLeftMaxByQualifierSaveToTable_E(
	const TQualifierIndex qualifier )
{
	CUnitNode* first = left;
	while( !isEmpty() && checkQualifier( left->Next(), qualifier ) ) {
		left = left->Next();
		if( left->IsLeftParen() ) {
			left = left->PairedParen();
		}
	}
	if( left == first ) {
		saveToTable( 0, 0 );
	} else {
		saveToTable( first->Next(), left );
	}
}